

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O1

void __thiscall FIX::FieldBase::encodeTo(FieldBase *this,string *result)

{
  pointer pcVar1;
  uint uVar2;
  size_type sVar3;
  pointer pcVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  pointer pcVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  
  uVar2 = this->m_tag;
  uVar12 = -uVar2;
  if (0 < (int)uVar2) {
    uVar12 = uVar2;
  }
  uVar8 = 0;
  if (9999 < uVar12) {
    uVar8 = 0;
    uVar6 = uVar12;
    do {
      uVar8 = uVar8 + 4;
      uVar12 = uVar6 / 10000;
      bVar5 = 99999999 < uVar6;
      uVar6 = uVar6 / 10000;
    } while (bVar5);
  }
  if (uVar12 < 100) {
    if (uVar12 < 10) {
      uVar8 = uVar8 | 1;
    }
    else {
      uVar8 = uVar8 | 2;
    }
  }
  else if (uVar12 < 1000) {
    uVar8 = uVar8 | 3;
  }
  else {
    uVar8 = uVar8 + 4;
  }
  iVar7 = uVar8 - ((int)uVar2 >> 0x1f);
  sVar3 = (this->m_string)._M_string_length;
  std::__cxx11::string::resize((ulong)result,(char)sVar3 + (char)iVar7 + '\x02');
  pcVar4 = (result->_M_dataplus)._M_p;
  uVar2 = this->m_tag;
  pcVar1 = pcVar4 + iVar7;
  uVar12 = -uVar2;
  if (0 < (int)uVar2) {
    uVar12 = uVar2;
  }
  pcVar9 = pcVar1;
  uVar8 = uVar12;
  if (99 < uVar12) {
    do {
      uVar8 = uVar12 / 100;
      *(undefined2 *)(pcVar9 + -2) = *(undefined2 *)(digit_pairs + (ulong)(uVar12 % 100) * 2);
      pcVar9 = pcVar9 + -2;
      bVar5 = 9999 < uVar12;
      uVar12 = uVar12 / 100;
    } while (bVar5);
  }
  if (uVar8 < 10) {
    bVar11 = (byte)uVar8 | 0x30;
    lVar10 = -1;
  }
  else {
    pcVar9[-1] = digit_pairs[((ulong)uVar8 * 2 & 0xffffffff) + 1];
    bVar11 = digit_pairs[(ulong)uVar8 * 2];
    lVar10 = -2;
  }
  pcVar9[lVar10] = bVar11;
  if ((int)uVar2 < 0) {
    pcVar9[lVar10 + -1] = '-';
  }
  *pcVar1 = '=';
  memcpy(pcVar1 + 1,(this->m_string)._M_dataplus._M_p,(this->m_string)._M_string_length);
  pcVar4[sVar3 + (long)iVar7 + 1] = '\x01';
  return;
}

Assistant:

void encodeTo( std::string& result ) const
  {
    size_t tagLength = FIX::number_of_symbols_in( m_tag );
    size_t totalLength = tagLength + m_string.length() + 2;

    result.resize( totalLength );

    char * buf = (char*)result.c_str();
    FIX::integer_to_string( buf, tagLength, m_tag );

    buf[tagLength] = '=';
    memcpy( buf + tagLength + 1, m_string.data(), m_string.length() );
    buf[totalLength - 1] = '\001';
  }